

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_rkv.c
# Opt level: O1

MPP_RET hal_h265d_rkv_wait(void *hal,HalTaskInfo *task)

{
  RK_S32 index;
  long lVar1;
  MPP_RET MVar2;
  RK_U32 RVar3;
  long *plVar4;
  MppFrame s;
  ulong uVar5;
  MPP_RET MVar6;
  MppFrame mframe;
  MppFrame frame_out;
  MppFrame local_48;
  long local_40;
  MppFrame local_38;
  
  local_40 = (long)(task->dec).reg_index * 5;
  plVar4 = (long *)((long)hal + (long)(task->dec).reg_index * 0x28 + 0x128);
  if (*(int *)((long)hal + 0x180) == 0) {
    plVar4 = (long *)((long)hal + 0x100);
  }
  lVar1 = *plVar4;
  if ((((task->dec).flags.val & 4) == 0) &&
     ((((task->dec).flags.val & 8) == 0 || (*(int *)(*(long *)((long)hal + 0x18) + 0x30) != 0)))) {
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0x10,(void *)0x0);
    MVar6 = MPP_OK;
    if (MVar2 != MPP_OK) {
      _mpp_log_l(2,"hal_h265d_rkv","poll cmd failed %d\n","hal_h265d_rkv_wait",(ulong)(uint)MVar2);
      MVar6 = MVar2;
    }
  }
  else {
    MVar6 = MPP_OK;
    if (((byte)hal_h265d_debug & 0x20) != 0) {
      MVar6 = MPP_OK;
      _mpp_log_l(4,"hal_h265d_rkv","%s found task error\n",(char *)0x0,"hal_h265d_rkv_wait");
    }
  }
  if ((((ulong)(task->dec).flags & 0xc) == 0) && ((*(ushort *)(lVar1 + 5) & 0x1c0) == 0)) {
    if ((*(int *)((long)hal + 0x180) != 0) && (*(int *)((long)hal + 400) != 0)) {
      uVar5 = 0;
      do {
        index = *(RK_S32 *)((long)task + uVar5 * 4 + 0x38);
        if (-1 < index) {
          local_48 = (MppFrame)0x0;
          mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x20),index,SLOT_FRAME_PTR,&local_48);
          if (((byte)hal_h265d_debug & 0x10) != 0) {
            _mpp_log_l(4,"hal_h265d_rkv","refer[%d] %d frame %p\n",(char *)0x0,uVar5 & 0xffffffff,
                       (ulong)*(uint *)((long)task + uVar5 * 4 + 0x38),local_48);
          }
          if (local_48 != (MppFrame)0x0) {
            RVar3 = mpp_frame_get_errinfo(local_48);
            if (RVar3 != 0) {
              local_38 = (MppFrame)0x0;
              mpp_buf_slot_get_prop
                        (*(MppBufSlots *)((long)hal + 0x20),(task->dec).output,SLOT_FRAME_PTR,
                         &local_38);
              s = local_38;
              goto LAB_001f125b;
            }
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x11);
    }
  }
  else if (*(int *)((long)hal + 0x180) == 0) {
    if (*(MppCbCtx **)((long)hal + 0x188) != (MppCbCtx *)0x0) {
      mpp_callback_f("hal_h265d_rkv_wait",*(MppCbCtx **)((long)hal + 0x188),task);
    }
  }
  else {
    local_48 = (MppFrame)0x0;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x20),(task->dec).output,SLOT_FRAME_PTR,&local_48);
    if (local_48 != (MppFrame)0x0) {
      *(undefined4 *)((long)hal + 400) = 1;
      s = local_48;
LAB_001f125b:
      mpp_frame_set_errinfo(s,1);
    }
  }
  if (((byte)hal_h265d_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265d_rkv","RK_HEVC_DEC: regs[1]=0x%08X, regs[45]=0x%08x\n",(char *)0x0,
               (ulong)*(uint *)(lVar1 + 4),(ulong)*(uint *)(lVar1 + 0xb4));
  }
  if (*(int *)((long)hal + 0x180) != 0) {
    *(undefined4 *)((long)hal + local_40 * 8 + 0x108) = 0;
  }
  return MVar6;
}

Assistant:

MPP_RET hal_h265d_rkv_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    RK_S32 index =  task->dec.reg_index;
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;
    H265d_REGS_t *hw_regs = NULL;
    RK_S32 i;

    if (reg_ctx->fast_mode) {
        hw_regs = ( H265d_REGS_t *)reg_ctx->g_buf[index].hw_regs;
    } else {
        hw_regs = ( H265d_REGS_t *)reg_ctx->hw_regs;
    }

    if (task->dec.flags.parse_err ||
        (task->dec.flags.ref_err && !reg_ctx->cfg->base.disable_error)) {
        h265h_dbg(H265H_DBG_TASK_ERR, "%s found task error\n", __FUNCTION__);
        goto ERR_PROC;
    }

    ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

ERR_PROC:
    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err ||
        hw_regs->sw_interrupt.sw_dec_error_sta ||
        hw_regs->sw_interrupt.sw_dec_timeout_sta ||
        hw_regs->sw_interrupt.sw_dec_empty_sta) {
        if (!reg_ctx->fast_mode) {
            if (reg_ctx->dec_cb)
                mpp_callback(reg_ctx->dec_cb, &task->dec);
        } else {
            MppFrame mframe = NULL;
            mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.output,
                                  SLOT_FRAME_PTR, &mframe);
            if (mframe) {
                reg_ctx->fast_mode_err_found = 1;
                mpp_frame_set_errinfo(mframe, 1);
            }
        }
    } else {
        if (reg_ctx->fast_mode && reg_ctx->fast_mode_err_found) {
            for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(task->dec.refer); i++) {
                if (task->dec.refer[i] >= 0) {
                    MppFrame frame_ref = NULL;

                    mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.refer[i],
                                          SLOT_FRAME_PTR, &frame_ref);
                    h265h_dbg(H265H_DBG_FAST_ERR, "refer[%d] %d frame %p\n",
                              i, task->dec.refer[i], frame_ref);
                    if (frame_ref && mpp_frame_get_errinfo(frame_ref)) {
                        MppFrame frame_out = NULL;
                        mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.output,
                                              SLOT_FRAME_PTR, &frame_out);
                        mpp_frame_set_errinfo(frame_out, 1);
                        break;
                    }
                }
            }
        }
    }

    if (hal_h265d_debug & H265H_DBG_REG) {
        h265h_dbg(H265H_DBG_REG, "RK_HEVC_DEC: regs[1]=0x%08X, regs[45]=0x%08x\n", ((RK_U32 *)hw_regs)[1], ((RK_U32 *)hw_regs)[45]);
    }

    if (reg_ctx->fast_mode) {
        reg_ctx->g_buf[index].use_flag = 0;
    }

    return ret;
}